

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCountLuts(Kit_DsdNtk_t *pNtk,int nLutSize)

{
  uint in_EAX;
  int iVar1;
  Kit_DsdObj_t *pKVar2;
  ulong uStack_28;
  int Counter;
  
  uStack_28 = (ulong)in_EAX;
  pKVar2 = Kit_DsdNtkRoot(pNtk);
  iVar1 = 0;
  if (((uint)*pKVar2 & 0x1c0) != 0x40) {
    pKVar2 = Kit_DsdNtkRoot(pNtk);
    if (((uint)*pKVar2 & 0x1c0) != 0x80) {
      iVar1 = Abc_Lit2Var((uint)pNtk->Root);
      Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar1,&Counter);
      iVar1 = -1;
      if (Counter < 1000) {
        iVar1 = Counter;
      }
    }
  }
  return iVar1;
}

Assistant:

int Kit_DsdCountLuts( Kit_DsdNtk_t * pNtk, int nLutSize )
{
    int Counter = 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_VAR )
        return 0;
    Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pNtk->Root), &Counter );
    if ( Counter >= 1000 )
        return -1;
    return Counter;
}